

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerListOverwritesExisting<phmap::flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>_>
::TestBody(AssignmentFromInitializerListOverwritesExisting<phmap::flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>_>
           *this)

{
  Generator<phmap::priv::hash_internal::Enum,_void> *this_00;
  testing *this_01;
  initializer_list<phmap::priv::hash_internal::Enum> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  *s;
  initializer_list<phmap::priv::hash_internal::Enum> xs;
  AssertHelper local_1a0;
  Message local_198;
  vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  local_190;
  testing *local_178;
  iterator pEStack_170;
  UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum> local_160;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum>_>
  local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_108 [3];
  StatefulTestingHash local_f0;
  testing *local_e8;
  iterator pEStack_e0;
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  local_d0;
  undefined1 local_88 [8];
  TypeParam m;
  initializer_list<phmap::priv::hash_internal::Enum> values;
  Generator<phmap::priv::hash_internal::Enum,_void> gen;
  AssignmentFromInitializerListOverwritesExisting<phmap::flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum> *matcher;
  
  this_00 = (Generator<phmap::priv::hash_internal::Enum,_void> *)((long)&values._M_len + 7);
  m.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ =
       hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  this_01 = (testing *)
            ((long)&m.
                    super_raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    .settings_.
                    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 4);
  values._M_array = (iterator)0x5;
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::flat_hash_set((flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                   *)local_88);
  pEStack_e0 = values._M_array;
  local_f0.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  local_e8 = this_01;
  StatefulTestingHash::StatefulTestingHash(&local_f0);
  local_108[0].super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(local_108);
  Alloc<phmap::priv::hash_internal::Enum>::Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)&gtest_ar.message_,0);
  iVar1._M_len = (size_type)pEStack_e0;
  iVar1._M_array = (iterator)local_e8;
  sVar3 = 0;
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::raw_hash_set(&local_d0,iVar1,0,&local_f0,local_108,(allocator_type *)&gtest_ar.message_);
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::operator=((flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
               *)local_88,&local_d0);
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~flat_hash_set(&local_d0);
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)&gtest_ar.message_);
  pEStack_170 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  local_178 = this_01;
  testing::UnorderedElementsAreArray<phmap::priv::hash_internal::Enum>(&local_160,this_01,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum>>
            (&local_140,(internal *)&local_160,matcher);
  keys<phmap::flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>>
            (&local_190,(priv *)local_88,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum>>
  ::operator()(local_120,(char *)&local_140,
               (vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
                *)"keys(m)");
  std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>::
  ~vector(&local_190);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum>_>
  ::~PredicateFormatterFromMatcher(&local_140);
  testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::Enum>::
  ~UnorderedElementsAreArrayMatcher(&local_160);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1d3,message);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~flat_hash_set((flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    *)local_88);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerListOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}